

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

SPIRString * __thiscall spirv_cross::Variant::get<spirv_cross::SPIRString>(Variant *this)

{
  CompilerError *pCVar1;
  allocator local_39;
  string local_38;
  
  if ((SPIRString *)this->holder == (SPIRString *)0x0) {
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"nullptr",&local_39);
    CompilerError::CompilerError(pCVar1,&local_38);
    __cxa_throw(pCVar1,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (this->type == TypeString) {
    return (SPIRString *)this->holder;
  }
  pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Bad cast",&local_39);
  CompilerError::CompilerError(pCVar1,&local_38);
  __cxa_throw(pCVar1,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

T &get()
	{
		if (!holder)
			SPIRV_CROSS_THROW("nullptr");
		if (static_cast<Types>(T::type) != type)
			SPIRV_CROSS_THROW("Bad cast");
		return *static_cast<T *>(holder);
	}